

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

int __thiscall
google::protobuf::Reflection::GetEnumValue(Reflection *this,Message *message,FieldDescriptor *field)

{
  byte bVar1;
  Descriptor *pDVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  int *piVar6;
  EnumValueDescriptor *pEVar7;
  char *description;
  OneofDescriptor *oneof_descriptor;
  Metadata MVar8;
  
  MVar8 = Message::GetMetadata(message);
  if (MVar8.reflection != this) {
LAB_001f2dce:
    pDVar2 = this->descriptor_;
    MVar8 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar2,MVar8.descriptor,field,"GetEnumValue");
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ == pDVar2) {
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
      GetEnumValue();
      goto LAB_001f2dce;
    }
    if ((bVar1 & 0x20) == 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 8) {
        anon_unknown_6::ReportReflectionUsageTypeError(pDVar2,field,"GetEnumValue",CPPTYPE_ENUM);
      }
      if ((bVar1 & 8) != 0) {
        uVar5 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        iVar4 = field->number_;
        pEVar7 = FieldDescriptor::default_value_enum(field);
        iVar4 = internal::ExtensionSet::GetEnum
                          ((ExtensionSet *)
                           ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
                           iVar4,pEVar7->number_);
        return iVar4;
      }
      bVar3 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
      if (bVar3) {
        if ((field->field_0x1 & 0x10) == 0) {
          oneof_descriptor = (OneofDescriptor *)0x0;
        }
        else {
          oneof_descriptor = (field->scope_).containing_oneof;
          if (oneof_descriptor == (OneofDescriptor *)0x0) {
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb31);
          }
        }
        uVar5 = GetOneofCase(this,message,oneof_descriptor);
        if (uVar5 != field->number_) {
          pEVar7 = FieldDescriptor::default_value_enum(field);
          return pEVar7->number_;
        }
      }
      piVar6 = GetRaw<int>(this,message,field);
      return *piVar6;
    }
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"GetEnumValue",description);
}

Assistant:

int Reflection::GetEnumValue(const Message& message,
                             const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetEnumValue, SINGULAR, ENUM);

  int32_t value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetEnum(
        field->number(), field->default_value_enum()->number());
  } else if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
    value = field->default_value_enum()->number();
  } else {
    value = GetField<int>(message, field);
  }
  return value;
}